

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.cc
# Opt level: O1

void md4_block_data_order(uint32_t *state,uint8_t *data,size_t num)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint32_t uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  if (num != 0) {
    uVar18 = state[3];
    uVar20 = state[2];
    uVar17 = *state;
    uVar24 = state[1];
    do {
      iVar1 = *(int *)data;
      iVar2 = *(int *)((long)data + 4);
      uVar21 = ((uVar20 ^ uVar18) & uVar24 ^ uVar18) + uVar17 + iVar1;
      iVar3 = *(int *)((long)data + 8);
      uVar22 = uVar21 * 8 | uVar21 >> 0x1d;
      uVar21 = ((uVar24 ^ uVar20) & uVar22 ^ uVar20) + iVar2 + uVar18;
      uVar21 = uVar21 * 0x80 | uVar21 >> 0x19;
      uVar19 = ((uVar22 ^ uVar24) & uVar21 ^ uVar24) + iVar3 + uVar20;
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      iVar4 = *(int *)((long)data + 0xc);
      iVar5 = *(int *)((long)data + 0x10);
      uVar23 = ((uVar21 ^ uVar22) & uVar19 ^ uVar22) + iVar4 + uVar24;
      uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
      iVar6 = *(int *)((long)data + 0x14);
      uVar22 = uVar22 + iVar5 + ((uVar19 ^ uVar21) & uVar23 ^ uVar21);
      iVar7 = *(int *)((long)data + 0x18);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar6 + ((uVar23 ^ uVar19) & uVar22 ^ uVar19);
      uVar21 = uVar21 * 0x80 | uVar21 >> 0x19;
      uVar19 = uVar19 + iVar7 + ((uVar22 ^ uVar23) & uVar21 ^ uVar23);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      iVar8 = *(int *)((long)data + 0x1c);
      uVar23 = uVar23 + iVar8 + ((uVar21 ^ uVar22) & uVar19 ^ uVar22);
      uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
      iVar9 = *(int *)((long)data + 0x20);
      uVar22 = uVar22 + iVar9 + ((uVar19 ^ uVar21) & uVar23 ^ uVar21);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      iVar10 = *(int *)((long)data + 0x24);
      uVar21 = uVar21 + iVar10 + ((uVar23 ^ uVar19) & uVar22 ^ uVar19);
      uVar21 = uVar21 * 0x80 | uVar21 >> 0x19;
      iVar11 = *(int *)((long)data + 0x28);
      uVar19 = uVar19 + iVar11 + ((uVar22 ^ uVar23) & uVar21 ^ uVar23);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      iVar12 = *(int *)((long)data + 0x2c);
      uVar23 = uVar23 + iVar12 + ((uVar21 ^ uVar22) & uVar19 ^ uVar22);
      uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
      iVar13 = *(int *)((long)data + 0x30);
      uVar22 = uVar22 + iVar13 + ((uVar19 ^ uVar21) & uVar23 ^ uVar21);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      iVar14 = *(int *)((long)data + 0x34);
      uVar21 = uVar21 + iVar14 + ((uVar23 ^ uVar19) & uVar22 ^ uVar19);
      uVar21 = uVar21 * 0x80 | uVar21 >> 0x19;
      iVar15 = *(int *)((long)data + 0x38);
      uVar19 = uVar19 + iVar15 + ((uVar22 ^ uVar23) & uVar21 ^ uVar23);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      iVar16 = *(int *)((long)data + 0x3c);
      uVar23 = uVar23 + iVar16 + ((uVar21 ^ uVar22) & uVar19 ^ uVar22);
      uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
      uVar22 = uVar22 + iVar1 + 0x5a827999 + (uVar19 & uVar21 | (uVar19 | uVar21) & uVar23);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar5 + 0x5a827999 + ((uVar23 | uVar19) & uVar22 | uVar23 & uVar19);
      uVar21 = uVar21 * 0x20 | uVar21 >> 0x1b;
      uVar19 = uVar19 + iVar9 + 0x5a827999 + ((uVar22 | uVar23) & uVar21 | uVar22 & uVar23);
      uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
      uVar23 = uVar23 + iVar13 + 0x5a827999 + ((uVar21 | uVar22) & uVar19 | uVar21 & uVar22);
      uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
      uVar22 = uVar22 + iVar2 + 0x5a827999 + ((uVar19 | uVar21) & uVar23 | uVar19 & uVar21);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar6 + 0x5a827999 + ((uVar23 | uVar19) & uVar22 | uVar23 & uVar19);
      uVar21 = uVar21 * 0x20 | uVar21 >> 0x1b;
      uVar19 = uVar19 + iVar10 + 0x5a827999 + ((uVar22 | uVar23) & uVar21 | uVar22 & uVar23);
      uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
      uVar23 = uVar23 + iVar14 + 0x5a827999 + ((uVar21 | uVar22) & uVar19 | uVar21 & uVar22);
      uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
      uVar22 = uVar22 + iVar3 + 0x5a827999 + ((uVar19 | uVar21) & uVar23 | uVar19 & uVar21);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar7 + 0x5a827999 + ((uVar23 | uVar19) & uVar22 | uVar23 & uVar19);
      uVar21 = uVar21 * 0x20 | uVar21 >> 0x1b;
      uVar19 = uVar19 + iVar11 + 0x5a827999 + ((uVar22 | uVar23) & uVar21 | uVar22 & uVar23);
      uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
      uVar23 = uVar23 + iVar15 + 0x5a827999 + ((uVar21 | uVar22) & uVar19 | uVar21 & uVar22);
      uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
      uVar22 = uVar22 + iVar4 + 0x5a827999 + ((uVar19 | uVar21) & uVar23 | uVar19 & uVar21);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar8 + 0x5a827999 + ((uVar23 | uVar19) & uVar22 | uVar23 & uVar19);
      uVar21 = uVar21 * 0x20 | uVar21 >> 0x1b;
      uVar19 = uVar19 + iVar12 + 0x5a827999 + ((uVar22 | uVar23) & uVar21 | uVar22 & uVar23);
      uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
      uVar23 = uVar23 + iVar16 + 0x5a827999 + ((uVar21 | uVar22) & uVar19 | uVar21 & uVar22);
      uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
      uVar22 = uVar22 + iVar1 + 0x6ed9eba1 + (uVar23 ^ uVar19 ^ uVar21);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar9 + 0x6ed9eba1 + (uVar23 ^ uVar19 ^ uVar22);
      uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
      uVar19 = uVar19 + iVar5 + 0x6ed9eba1 + (uVar22 ^ uVar23 ^ uVar21);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      uVar23 = uVar23 + iVar13 + 0x6ed9eba1 + (uVar21 ^ uVar22 ^ uVar19);
      uVar23 = uVar23 * 0x8000 | uVar23 >> 0x11;
      uVar22 = uVar22 + iVar3 + 0x6ed9eba1 + (uVar19 ^ uVar21 ^ uVar23);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar11 + 0x6ed9eba1 + (uVar23 ^ uVar19 ^ uVar22);
      uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
      uVar19 = uVar19 + iVar7 + 0x6ed9eba1 + (uVar22 ^ uVar23 ^ uVar21);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      uVar23 = uVar23 + iVar15 + 0x6ed9eba1 + (uVar21 ^ uVar22 ^ uVar19);
      uVar23 = uVar23 * 0x8000 | uVar23 >> 0x11;
      uVar22 = uVar22 + iVar2 + 0x6ed9eba1 + (uVar19 ^ uVar21 ^ uVar23);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar10 + 0x6ed9eba1 + (uVar23 ^ uVar19 ^ uVar22);
      uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
      uVar19 = uVar19 + iVar6 + 0x6ed9eba1 + (uVar22 ^ uVar23 ^ uVar21);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      uVar23 = uVar23 + iVar14 + 0x6ed9eba1 + (uVar21 ^ uVar22 ^ uVar19);
      uVar23 = uVar23 * 0x8000 | uVar23 >> 0x11;
      uVar22 = uVar22 + iVar4 + 0x6ed9eba1 + (uVar19 ^ uVar21 ^ uVar23);
      uVar22 = uVar22 * 8 | uVar22 >> 0x1d;
      uVar21 = uVar21 + iVar12 + 0x6ed9eba1 + (uVar23 ^ uVar19 ^ uVar22);
      uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
      uVar17 = uVar17 + uVar22;
      uVar19 = uVar19 + iVar8 + 0x6ed9eba1 + (uVar22 ^ uVar23 ^ uVar21);
      uVar19 = uVar19 * 0x800 | uVar19 >> 0x15;
      uVar22 = uVar23 + iVar16 + 0x6ed9eba1 + (uVar21 ^ uVar22 ^ uVar19);
      uVar24 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar24;
      uVar20 = uVar19 + uVar20;
      uVar18 = uVar21 + uVar18;
      data = (uint8_t *)((long)data + 0x40);
      *state = uVar17;
      state[1] = uVar24;
      state[2] = uVar20;
      state[3] = uVar18;
      num = num - 1;
    } while (num != 0);
  }
  return;
}

Assistant:

static void md4_block_data_order(uint32_t *state, const uint8_t *data,
                                 size_t num) {
  uint32_t A, B, C, D;
  uint32_t X0, X1, X2, X3, X4, X5, X6, X7, X8, X9, X10, X11, X12, X13, X14, X15;

  A = state[0];
  B = state[1];
  C = state[2];
  D = state[3];

  for (; num--;) {
    X0 = CRYPTO_load_u32_le(data);
    data += 4;
    X1 = CRYPTO_load_u32_le(data);
    data += 4;
    // Round 0
    R0(A, B, C, D, X0, 3, 0);
    X2 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X1, 7, 0);
    X3 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X2, 11, 0);
    X4 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(B, C, D, A, X3, 19, 0);
    X5 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(A, B, C, D, X4, 3, 0);
    X6 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X5, 7, 0);
    X7 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X6, 11, 0);
    X8 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(B, C, D, A, X7, 19, 0);
    X9 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(A, B, C, D, X8, 3, 0);
    X10 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X9, 7, 0);
    X11 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X10, 11, 0);
    X12 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(B, C, D, A, X11, 19, 0);
    X13 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(A, B, C, D, X12, 3, 0);
    X14 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(D, A, B, C, X13, 7, 0);
    X15 = CRYPTO_load_u32_le(data);
    data += 4;
    R0(C, D, A, B, X14, 11, 0);
    R0(B, C, D, A, X15, 19, 0);
    // Round 1
    R1(A, B, C, D, X0, 3, 0x5A827999L);
    R1(D, A, B, C, X4, 5, 0x5A827999L);
    R1(C, D, A, B, X8, 9, 0x5A827999L);
    R1(B, C, D, A, X12, 13, 0x5A827999L);
    R1(A, B, C, D, X1, 3, 0x5A827999L);
    R1(D, A, B, C, X5, 5, 0x5A827999L);
    R1(C, D, A, B, X9, 9, 0x5A827999L);
    R1(B, C, D, A, X13, 13, 0x5A827999L);
    R1(A, B, C, D, X2, 3, 0x5A827999L);
    R1(D, A, B, C, X6, 5, 0x5A827999L);
    R1(C, D, A, B, X10, 9, 0x5A827999L);
    R1(B, C, D, A, X14, 13, 0x5A827999L);
    R1(A, B, C, D, X3, 3, 0x5A827999L);
    R1(D, A, B, C, X7, 5, 0x5A827999L);
    R1(C, D, A, B, X11, 9, 0x5A827999L);
    R1(B, C, D, A, X15, 13, 0x5A827999L);
    // Round 2
    R2(A, B, C, D, X0, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X8, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X4, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X12, 15, 0x6ED9EBA1L);
    R2(A, B, C, D, X2, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X10, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X6, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X14, 15, 0x6ED9EBA1L);
    R2(A, B, C, D, X1, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X9, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X5, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X13, 15, 0x6ED9EBA1L);
    R2(A, B, C, D, X3, 3, 0x6ED9EBA1L);
    R2(D, A, B, C, X11, 9, 0x6ED9EBA1L);
    R2(C, D, A, B, X7, 11, 0x6ED9EBA1L);
    R2(B, C, D, A, X15, 15, 0x6ED9EBA1L);

    A = state[0] += A;
    B = state[1] += B;
    C = state[2] += C;
    D = state[3] += D;
  }
}